

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O2

error_or<int> * __thiscall
pstore::http::send_message<WsServer_Ping_Test::TestBody()::__2,int>
          (error_or<int> *__return_storage_ptr__,http *this,anon_class_8_1_65350a3f sender,int io,
          opcode op,span<const_unsigned_char,__1L> *span)

{
  ulong uVar1;
  ulong *puVar2;
  uint *puVar3;
  uint uVar4;
  anon_class_8_1_65350a3f sender_00;
  anon_class_8_1_65350a3f sender_01;
  anon_class_8_1_65350a3f sender_02;
  anon_class_8_1_65350a3f sender_03;
  anon_class_8_1_65350a3f sender_04;
  error_or<int> *this_00;
  unsigned_short v;
  opcode oVar5;
  undefined4 in_register_00000084;
  error_code eVar6;
  span<const_unsigned_long,__1L> sVar7;
  error_code erc;
  error_code erc_00;
  error_code erc_01;
  span<const_unsigned_long,__1L> s;
  error_code erc_02;
  error_or<int> local_70;
  error_or<int> local_58;
  unsigned_long nv;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_38;
  
  v = (unsigned_short)op;
  puVar2 = (ulong *)CONCAT44(in_register_00000084,op);
  uVar4 = (io & 0xfU) << 8;
  uVar1 = *(ulong *)CONCAT44(in_register_00000084,op);
  if ((long)uVar1 < 0x7e) {
    oVar5 = op;
    send<WsServer_Ping_Test::TestBody()::__2,int,unsigned_short,void>
              (&local_70,this,sender,uVar4 | (uint)uVar1 & 0x7f | 0x8000,v);
    if (local_70.has_error_ == false) {
      puVar3 = (uint *)error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&local_70);
      sender_00.output._4_4_ = 0;
      sender_00.output._0_4_ = *puVar3;
      send<WsServer_Ping_Test::TestBody()::__2,int>
                (__return_storage_ptr__,this,sender_00,op,
                 (span<const_unsigned_char,__1L> *)CONCAT44(in_register_00000084,oVar5));
    }
    else {
      eVar6 = error_or<int>::get_error(&local_70);
      erc._M_cat = eVar6._M_cat;
      erc._4_4_ = 0;
      erc._M_value = eVar6._M_value;
      error_or<int>::error_or(__return_storage_ptr__,erc);
    }
    this_00 = &local_70;
    goto LAB_0013a147;
  }
  if (uVar1 < 0x10000) {
    oVar5 = op;
    send<WsServer_Ping_Test::TestBody()::__2,int,unsigned_short,void>
              (&local_58,this,sender,uVar4 | 0x807e,v);
    if (local_58.has_error_ == false) {
      puVar3 = (uint *)error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&local_58);
      uVar1 = *puVar2;
      if (0xffff < uVar1) {
        assert_failed("size >= 0 && static_cast< std::make_unsigned<std::remove_const<decltype (size)>::type>::type> ( size) <= std::numeric_limits<LengthType>::max ()"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/http/ws_server.hpp"
                      ,0x144);
      }
      sender_03.output._4_4_ = 0;
      sender_03.output._0_4_ = *puVar3;
      send<WsServer_Ping_Test::TestBody()::__2,int,unsigned_short,void>
                (&local_70,this,sender_03,(uint)uVar1 & 0xffff,(unsigned_short)oVar5);
    }
    else {
      eVar6 = error_or<int>::get_error(&local_58);
      erc_01._M_cat = eVar6._M_cat;
      erc_01._4_4_ = 0;
      erc_01._M_value = eVar6._M_value;
      error_or<int>::error_or(&local_70,erc_01);
    }
    if (local_70.has_error_ != false) goto LAB_0013a108;
    puVar3 = (uint *)error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&local_70);
    sender_04.output._4_4_ = 0;
    sender_04.output._0_4_ = *puVar3;
    send<WsServer_Ping_Test::TestBody()::__2,int>
              (__return_storage_ptr__,this,sender_04,op,
               (span<const_unsigned_char,__1L> *)CONCAT44(in_register_00000084,oVar5));
  }
  else {
    oVar5 = op;
    send<WsServer_Ping_Test::TestBody()::__2,int,unsigned_short,void>
              (&local_58,this,sender,uVar4 | 0x807f,v);
    if (local_58.has_error_ == false) {
      puVar3 = (uint *)error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&local_58);
      uVar1 = *puVar2;
      if ((long)uVar1 < 0) {
        assert_failed("size >= 0 && static_cast< std::make_unsigned<std::remove_const<decltype (size)>::type>::type> ( size) <= std::numeric_limits<LengthType>::max ()"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/http/ws_server.hpp"
                      ,0x144);
      }
      uVar4 = *puVar3;
      nv = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
           (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
           (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
      sVar7 = pstore::gsl::make_span<unsigned_long_const>(&nv,1);
      s.storage_.data_ = (index_type)sVar7.storage_.data_;
      s.storage_.super_extent_type<_1L>.size_ = s.storage_.data_;
      local_38 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
                 pstore::gsl::as_bytes<unsigned_long_const,_1l>
                           ((gsl *)sVar7.storage_.super_extent_type<_1L>.size_.size_,s);
      sender_01.output._4_4_ = 0;
      sender_01.output._0_4_ = uVar4;
      send<WsServer_Ping_Test::TestBody()::__2,int>
                (&local_70,this,sender_01,(int)&local_38,
                 (span<const_unsigned_char,__1L> *)CONCAT44(in_register_00000084,oVar5));
    }
    else {
      eVar6 = error_or<int>::get_error(&local_58);
      erc_00._M_cat = eVar6._M_cat;
      erc_00._4_4_ = 0;
      erc_00._M_value = eVar6._M_value;
      error_or<int>::error_or(&local_70,erc_00);
    }
    if (local_70.has_error_ == false) {
      puVar3 = (uint *)error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&local_70);
      sender_02.output._4_4_ = 0;
      sender_02.output._0_4_ = *puVar3;
      send<WsServer_Ping_Test::TestBody()::__2,int>
                (__return_storage_ptr__,this,sender_02,op,
                 (span<const_unsigned_char,__1L> *)CONCAT44(in_register_00000084,oVar5));
    }
    else {
LAB_0013a108:
      eVar6 = error_or<int>::get_error(&local_70);
      erc_02._M_cat = eVar6._M_cat;
      erc_02._4_4_ = 0;
      erc_02._M_value = eVar6._M_value;
      error_or<int>::error_or(__return_storage_ptr__,erc_02);
    }
  }
  error_or<int>::~error_or(&local_70);
  this_00 = &local_58;
LAB_0013a147:
  error_or<int>::~error_or(this_00);
  return __return_storage_ptr__;
}

Assistant:

error_or<IO> send_message (Sender const sender, IO const io, opcode const op,
                                   gsl::span<std::uint8_t const> const & span) {
            frame_fixed_layout f{};
            f.fin = true;
            f.rsv = std::uint16_t{0};
            f.opcode = static_cast<std::uint16_t> (op);
            f.mask = false;

            auto const length = span.size ();
            if (length < 126) {
                f.payload_length = static_cast<std::uint16_t> (length);
                return send (sender, io, f.raw) >>=
                       [sender, &span] (IO io2) { return send (sender, io2, span); };
            }

            if (length <= std::numeric_limits<std::uint16_t>::max ()) {
                // Length is sent as 16-bits.
                f.payload_length = std::uint16_t{126};
                return details::send_extended_length_message<std::uint16_t> (sender, io, f, span);
            }

            // The payload length must not have the top bit set.
            if (static_cast<std::uint64_t> (length) & (std::uint64_t{1} << 63U)) {
                return error_or<IO>{make_error_code (ws_error::message_too_long)};
            }

            // Send the length as a full 64-bit value.
            f.payload_length = std::uint16_t{127};
            return details::send_extended_length_message<std::uint64_t> (sender, io, f, span);
        }